

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,4,3,0,4,3>,Eigen::Block<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>const,4,3,false>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,_4,_3,_0,_4,_3> *dst,
               Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>
               *src,assign_op<float,_float> *func)

{
  Matrix<float,_4,_3,_0,_4,_3> *dstExpr;
  undefined1 local_d0 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_98 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> *func_local;
  Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>
  *src_local;
  Matrix<float,_4,_3,_0,_4,_3> *dst_local;
  
  evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>_>
  ::evaluator((evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>_>
               *)local_98,src);
  resize_if_allowed<Eigen::Matrix<float,4,3,0,4,3>,Eigen::Block<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>const,4,3,false>,float,float>
            (dst,src,func);
  evaluator<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::evaluator
            ((evaluator<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)&kernel.m_dstExpr,dst);
  dstExpr = EigenBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
              *)local_d0,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_98,func,
             dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_2,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_d0);
  evaluator<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::~evaluator
            ((evaluator<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>_>
  ::~evaluator((evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>_>
                *)local_98);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}